

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

void do_sat_addsub_32(TCGContext_conflict1 *tcg_ctx,TCGv_i64 reg,TCGv_i64 val,_Bool u,_Bool d)

{
  int iVar1;
  uint uVar2;
  TCGv_i64 c2;
  undefined4 local_3c;
  TCGCond cond;
  TCGv_i64 bound;
  int64_t ibound;
  _Bool d_local;
  _Bool u_local;
  TCGv_i64 val_local;
  TCGv_i64 reg_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (u) {
    tcg_gen_ext32u_i64_aarch64(tcg_ctx,reg,reg);
  }
  else {
    tcg_gen_ext32s_i64_aarch64(tcg_ctx,reg,reg);
  }
  if (d) {
    tcg_gen_sub_i64(tcg_ctx,reg,reg,val);
    iVar1 = -0x80000000;
    if (u) {
      iVar1 = 0;
    }
    bound = (TCGv_i64)(long)iVar1;
    local_3c = TCG_COND_LT;
  }
  else {
    tcg_gen_add_i64(tcg_ctx,reg,reg,val);
    uVar2 = 0x7fffffff;
    if (u) {
      uVar2 = 0xffffffff;
    }
    bound = (TCGv_i64)(ulong)uVar2;
    local_3c = TCG_COND_GT;
  }
  c2 = tcg_const_i64_aarch64(tcg_ctx,(int64_t)bound);
  tcg_gen_movcond_i64_aarch64(tcg_ctx,local_3c,reg,reg,c2,c2,reg);
  tcg_temp_free_i64(tcg_ctx,c2);
  return;
}

Assistant:

static void do_sat_addsub_32(TCGContext *tcg_ctx, TCGv_i64 reg, TCGv_i64 val, bool u, bool d)
{
    int64_t ibound;
    TCGv_i64 bound;
    TCGCond cond;

    /* Use normal 64-bit arithmetic to detect 32-bit overflow.  */
    if (u) {
        tcg_gen_ext32u_i64(tcg_ctx, reg, reg);
    } else {
        tcg_gen_ext32s_i64(tcg_ctx, reg, reg);
    }
    if (d) {
        tcg_gen_sub_i64(tcg_ctx, reg, reg, val);
        ibound = (u ? 0 : INT32_MIN);
        cond = TCG_COND_LT;
    } else {
        tcg_gen_add_i64(tcg_ctx, reg, reg, val);
        ibound = (u ? UINT32_MAX : INT32_MAX);
        cond = TCG_COND_GT;
    }
    bound = tcg_const_i64(tcg_ctx, ibound);
    tcg_gen_movcond_i64(tcg_ctx, cond, reg, reg, bound, bound, reg);
    tcg_temp_free_i64(tcg_ctx, bound);
}